

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::RegisterProcessForMonitoring
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CSynchData *psdSynchData,
          CProcProcessLocalData *pProcLocalData)

{
  bool bVar1;
  PAL_ERROR PVar2;
  MonitoredProcessesListNode *pMVar3;
  int *piVar4;
  MonitoredProcessesListNode *pMVar5;
  LONG *pLVar6;
  
  InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  pMVar5 = (MonitoredProcessesListNode *)&this->m_pmplnMonitoredProcesses;
  do {
    pMVar5 = pMVar5->pNext;
    if (pMVar5 == (MonitoredProcessesListNode *)0x0) {
      pMVar3 = (MonitoredProcessesListNode *)InternalMalloc(0x30);
      if (pMVar3 == (MonitoredProcessesListNode *)0x0) {
        pMVar3 = (MonitoredProcessesListNode *)0x0;
      }
      else {
        *(undefined8 *)&pMVar3->fIsActualExitCode = 0;
        pMVar3->pProcLocalData = (CProcProcessLocalData *)0x0;
        pMVar3->psdSynchData = (CSynchData *)0x0;
        pMVar3->dwPid = 0;
        pMVar3->dwExitCode = 0;
        pMVar3->pNext = (_MonitoredProcessesListNode *)0x0;
        *(undefined8 *)&pMVar3->lRefCount = 0;
      }
      if (pMVar3 != (MonitoredProcessesListNode *)0x0) {
        pMVar3->lRefCount = 1;
        pMVar3->dwPid = *(DWORD *)pProcLocalData;
        pMVar3->dwExitCode = 0;
        pMVar3->pProcLocalData = pProcLocalData;
        pMVar3->psdSynchData = psdSynchData;
        LOCK();
        psdSynchData->m_lRefCount = psdSynchData->m_lRefCount + 1;
        UNLOCK();
        pMVar3->pNext = this->m_pmplnMonitoredProcesses;
        this->m_pmplnMonitoredProcesses = pMVar3;
        pLVar6 = &this->m_lMonitoredProcessesCount;
        goto LAB_0013bf05;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013bfa0;
      PVar2 = 8;
      bVar1 = true;
      goto LAB_0013bf7a;
    }
  } while (pMVar5->psdSynchData != psdSynchData);
  if (pMVar5->dwPid != *(DWORD *)pProcLocalData) {
    fprintf(_stderr,"] %s %s:%d","RegisterProcessForMonitoring",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xb72);
    fprintf(_stderr,
            "Expression: pmpln->dwPid == pProcLocalData->dwProcessId, Description: Invalid node in Monitored Processes List\n"
           );
  }
  pLVar6 = &pMVar5->lRefCount;
LAB_0013bf05:
  *pLVar6 = *pLVar6 + 1;
  InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  bVar1 = false;
  PVar2 = 0;
  if (pMVar5 == (MonitoredProcessesListNode *)0x0) {
    bVar1 = false;
    PVar2 = WakeUpLocalWorkerThread(s_pObjSynchMgr,SynchWorkerCmdNop);
    if (PVar2 == 0) {
      PVar2 = 0;
    }
    else {
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_0013bfa0:
        abort();
      }
      piVar4 = __errno_location();
      strerror(*piVar4);
      PVar2 = 0x54f;
      bVar1 = false;
    }
  }
LAB_0013bf7a:
  if (bVar1) {
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  }
  return PVar2;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::RegisterProcessForMonitoring(
        CPalThread * pthrCurrent,
        CSynchData *psdSynchData,
        CProcProcessLocalData * pProcLocalData)
    {
        PAL_ERROR palErr = NO_ERROR;
        MonitoredProcessesListNode * pmpln;
        bool fWakeUpWorker = false;
        bool fMonitoredProcessesLock = false;

        VALIDATEOBJECT(psdSynchData);

        InternalEnterCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = true;

        pmpln = m_pmplnMonitoredProcesses;
        while (pmpln)
        {
            if (psdSynchData == pmpln->psdSynchData)
            {
                _ASSERT_MSG(pmpln->dwPid == pProcLocalData->dwProcessId,
                            "Invalid node in Monitored Processes List\n");
                break;
            }

            pmpln = pmpln->pNext;
        }

        if (pmpln)
        {
            pmpln->lRefCount++;
        }
        else
        {
            pmpln = InternalNew<MonitoredProcessesListNode>();
            if (NULL == pmpln)
            {
                ERROR("No memory to allocate MonitoredProcessesListNode structure\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto RPFM_exit;
            }

            pmpln->lRefCount      = 1;
            pmpln->dwPid          = pProcLocalData->dwProcessId;
            pmpln->dwExitCode     = 0;
            pmpln->pProcLocalData = pProcLocalData;

            // Acquire SynchData and AddRef it
            pmpln->psdSynchData = psdSynchData;
            psdSynchData->AddRef();

            pmpln->pNext = m_pmplnMonitoredProcesses;
            m_pmplnMonitoredProcesses = pmpln;
            m_lMonitoredProcessesCount++;

            fWakeUpWorker = true;
        }
        // Unlock
        InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = false;

        if (fWakeUpWorker)
        {
            CPalSynchronizationManager * pSynchManager = GetInstance();

            palErr = pSynchManager->WakeUpLocalWorkerThread(SynchWorkerCmdNop);
            if (NO_ERROR != palErr)
            {
                ERROR("Failed waking up worker thread for process "
                      "monitoring registration [errno=%d {%s%}]\n",
                      errno, strerror(errno));
                palErr = ERROR_INTERNAL_ERROR;
            }
        }

    RPFM_exit:
        if (fMonitoredProcessesLock)
        {
            InternalLeaveCriticalSection(pthrCurrent,
                                         &s_csMonitoredProcessesLock);
        }
        return palErr;
    }